

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

bool UseNonStaticTemplate(ExpressionTranslateContext *ctx,FunctionData *function)

{
  ScopeData *pSVar1;
  TypeBase *pTVar2;
  long lVar3;
  
  pSVar1 = function->scope;
  if ((((pSVar1 != ctx->ctx->globalScope) && (pSVar1->ownerNamespace == (NamespaceData *)0x0)) &&
      (pSVar1->ownerType == (TypeBase *)0x0)) ||
     ((*(function->name->name).begin == '$' || (function->isHidden != false)))) {
    return false;
  }
  if (((function->isGenericInstance == false) && (function->proto == (FunctionData *)0x0)) &&
     (((pTVar2 = function->scope->ownerType, pTVar2 == (TypeBase *)0x0 || (pTVar2->typeID != 0x18))
      || (lVar3._0_4_ = pTVar2[2].typeIndex, lVar3._4_4_ = pTVar2[2].alignment, lVar3 == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool UseNonStaticTemplate(ExpressionTranslateContext &ctx, FunctionData *function)
{
	if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
		return false;
	else if(*function->name->name.begin == '$')
		return false;
	else if(function->isHidden)
		return false;
	else if(ctx.ctx.IsGenericInstance(function))
		return true;

	return false;
}